

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::EnumValueOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  FieldOptions_FeatureSupport *this_00;
  ulong uVar1;
  
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
    uVar1 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (FeatureSet *)self[4]._internal_metadata_.ptr_;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
    }
    operator_delete(this,0x50);
    this_00 = (FieldOptions_FeatureSupport *)self[5]._vptr_MessageLite;
    if (this_00 != (FieldOptions_FeatureSupport *)0x0) {
      FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(this_00);
    }
    operator_delete(this_00,0x30);
    RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)(self + 3));
    internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  SharedDtor((EnumValueOptions *)&stack0xffffffffffffffd8);
}

Assistant:

inline void EnumValueOptions::SharedDtor(MessageLite& self) {
  EnumValueOptions& this_ = static_cast<EnumValueOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.features_;
  delete this_._impl_.feature_support_;
  this_._impl_.~Impl_();
}